

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStream.cpp
# Opt level: O0

void __thiscall
DIS::DataStream::SetStream(DataStream *this,char *buffer,size_t length,Endian stream)

{
  value_type vVar1;
  size_type sVar2;
  reference pvVar3;
  uint local_28;
  uint i;
  Endian stream_local;
  size_t length_local;
  char *buffer_local;
  DataStream *this_local;
  
  this->_stream_endian = stream;
  this->_write_pos = length;
  this->_read_pos = 0;
  sVar2 = std::vector<char,_std::allocator<char>_>::size(&this->_buffer);
  if (sVar2 < length) {
    std::vector<char,_std::allocator<char>_>::resize(&this->_buffer,length);
  }
  for (local_28 = 0; local_28 < length; local_28 = local_28 + 1) {
    vVar1 = buffer[local_28];
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&this->_buffer,(ulong)local_28);
    *pvVar3 = vVar1;
  }
  return;
}

Assistant:

void DataStream::SetStream(const char* buffer, size_t length, Endian stream)
{
   // reassign the endian
   _stream_endian = stream;

   _write_pos = length;
   _read_pos = 0;

   // resize the array
   if( _buffer.size() < length )
   {
      _buffer.resize( length );
   }

   // take ownership of the data
   // copy the data, expensive!
   for(unsigned int i=0; i<length; ++i)
   {
      _buffer[i] = buffer[i];
   }
}